

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftLCbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  uint *puVar1;
  undefined8 uVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pcVar8 = &(this->theCoLbound->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  if (&local_68 == &to->m_backend) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,pcVar8);
    if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
      local_68.neg = (bool)(local_68.neg ^ 1);
      goto LAB_00292d3c;
    }
LAB_00292d47:
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 10;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems._24_5_ = 0;
    local_a8.data._M_elems[7]._1_3_ = 0;
    local_a8.data._M_elems._32_5_ = 0;
    local_a8.data._M_elems[9]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
    iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_68,&local_a8);
    if (0 < iVar7) {
      pcVar8 = &(this->theCoLbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (&local_a8 == &to->m_backend) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_a8,pcVar8)
        ;
        if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
          local_a8.neg = (bool)(local_a8.neg ^ 1);
        }
      }
      else {
        if (&local_a8 != pcVar8) {
          uVar2 = *(undefined8 *)((pcVar8->data)._M_elems + 8);
          local_a8.data._M_elems._32_5_ = SUB85(uVar2,0);
          local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar8->data)._M_elems;
          local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar8->data)._M_elems + 2);
          local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar8->data)._M_elems + 4);
          uVar2 = *(undefined8 *)((pcVar8->data)._M_elems + 6);
          local_a8.data._M_elems._24_5_ = SUB85(uVar2,0);
          local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_a8.exp = pcVar8->exp;
          local_a8.neg = pcVar8->neg;
          local_a8.fpclass = pcVar8->fpclass;
          local_a8.prec_elem = pcVar8->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_a8,&to->m_backend);
      }
      goto LAB_00292e1c;
    }
  }
  else {
    if (&local_68 != pcVar8) {
      uVar2 = *(undefined8 *)((pcVar8->data)._M_elems + 8);
      local_68.data._M_elems._32_5_ = SUB85(uVar2,0);
      local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar8->data)._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar8->data)._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar8->data)._M_elems + 4);
      uVar2 = *(undefined8 *)((pcVar8->data)._M_elems + 6);
      local_68.data._M_elems._24_5_ = SUB85(uVar2,0);
      local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
      local_68.exp = pcVar8->exp;
      local_68.neg = pcVar8->neg;
      local_68.fpclass = pcVar8->fpclass;
      local_68.prec_elem = pcVar8->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              (&local_68,&to->m_backend);
LAB_00292d3c:
    if (local_68.fpclass != cpp_dec_float_NaN) goto LAB_00292d47;
  }
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
LAB_00292e1c:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&local_a8);
  pnVar3 = (this->theCoLbound->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar3[i].m_backend.data + 0x20) =
       *(undefined8 *)((to->m_backend).data._M_elems + 8);
  uVar2 = *(undefined8 *)(to->m_backend).data._M_elems;
  uVar4 = *(undefined8 *)((to->m_backend).data._M_elems + 2);
  uVar5 = *(undefined8 *)((to->m_backend).data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((to->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar5;
  *(undefined8 *)&pnVar3[i].m_backend.data = uVar2;
  *(undefined8 *)((long)&pnVar3[i].m_backend.data + 8) = uVar4;
  pnVar3[i].m_backend.exp = (to->m_backend).exp;
  pnVar3[i].m_backend.neg = (to->m_backend).neg;
  iVar6 = (to->m_backend).prec_elem;
  pnVar3[i].m_backend.fpclass = (to->m_backend).fpclass;
  pnVar3[i].m_backend.prec_elem = iVar6;
  return;
}

Assistant:

void shiftLCbound(int i, R to)
   {
      assert(theType == LEAVE);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX((*theCoLbound)[i] - to, 0.0);
      (*theCoLbound)[i] = to;
   }